

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marshal.c
# Opt level: O1

unsigned_long BinarySource_get_uint32(BinarySource *src)

{
  uint uVar1;
  size_t sVar2;
  
  if (src->err == BSE_NO_ERROR) {
    if (3 < src->len - src->pos) {
      sVar2 = src->pos;
      src->pos = sVar2 + 4;
      uVar1 = *(uint *)((long)src->data + sVar2);
      return (ulong)(uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18
                    );
    }
    src->err = BSE_OUT_OF_DATA;
  }
  return 0;
}

Assistant:

static bool BinarySource_data_avail(BinarySource *src, size_t wanted)
{
    if (src->err)
        return false;

    if (wanted <= src->len - src->pos)
        return true;

    src->err = BSE_OUT_OF_DATA;
    return false;
}